

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O2

MPP_RET mpp_enc_ref_cfg_set_cfg_cnt(MppEncRefCfg ref,RK_S32 lt_cnt,RK_S32 st_cnt)

{
  MPP_RET MVar1;
  void *pvVar2;
  void *pvVar3;
  
  MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_set_cfg_cnt",ref);
  if (MVar1 == MPP_OK) {
    pvVar2 = *(void **)((long)ref + 0x28);
    pvVar3 = *(void **)((long)ref + 0x30);
    if (pvVar2 != (void *)0x0 || pvVar3 != (void *)0x0) {
      _mpp_log_l(2,"mpp_enc_ref","do call reset before setup new cnout\n",
                 "mpp_enc_ref_cfg_set_cfg_cnt");
      if (pvVar2 != (void *)0x0) {
        mpp_osal_free("mpp_enc_ref_cfg_set_cfg_cnt",pvVar2);
      }
      if (pvVar3 != (void *)0x0) {
        mpp_osal_free("mpp_enc_ref_cfg_set_cfg_cnt",pvVar3);
      }
    }
    if (lt_cnt == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = mpp_osal_calloc("mpp_enc_ref_cfg_set_cfg_cnt",(long)lt_cnt * 0x18);
      if (pvVar2 == (void *)0x0) {
        pvVar2 = (void *)0x0;
        _mpp_log_l(4,"mpp_enc_ref","failed to create %d lt ref cfg\n","mpp_enc_ref_cfg_set_cfg_cnt",
                   (ulong)(uint)lt_cnt);
      }
    }
    MVar1 = MPP_OK;
    if (st_cnt == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = mpp_osal_calloc("mpp_enc_ref_cfg_set_cfg_cnt",(long)st_cnt * 0x14);
      if (pvVar3 == (void *)0x0) {
        pvVar3 = (void *)0x0;
        _mpp_log_l(4,"mpp_enc_ref","failed to create %d st ref cfg\n","mpp_enc_ref_cfg_set_cfg_cnt",
                   (ulong)(uint)lt_cnt);
      }
    }
    *(RK_S32 *)((long)ref + 0x14) = lt_cnt;
    *(RK_S32 *)((long)ref + 0x18) = st_cnt;
    *(undefined8 *)((long)ref + 0x1c) = 0;
    *(void **)((long)ref + 0x28) = pvVar2;
    *(void **)((long)ref + 0x30) = pvVar3;
  }
  else {
    MVar1 = MPP_ERR_NULL_PTR;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_set_cfg_cnt(MppEncRefCfg ref, RK_S32 lt_cnt, RK_S32 st_cnt)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_NULL_PTR;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    MppEncRefLtFrmCfg *lt_cfg = p->lt_cfg;
    MppEncRefStFrmCfg *st_cfg = p->st_cfg;;

    if (lt_cfg || st_cfg) {
        mpp_err_f("do call reset before setup new cnout\n");
        MPP_FREE(lt_cfg);
        MPP_FREE(st_cfg);
    }

    if (lt_cnt) {
        lt_cfg = mpp_calloc(MppEncRefLtFrmCfg, lt_cnt);
        if (NULL == lt_cfg)
            mpp_log_f("failed to create %d lt ref cfg\n", lt_cnt);
    }

    if (st_cnt) {
        st_cfg = mpp_calloc(MppEncRefStFrmCfg, st_cnt);
        if (NULL == st_cfg)
            mpp_log_f("failed to create %d st ref cfg\n", lt_cnt);
    }

    p->max_lt_cfg = lt_cnt;
    p->max_st_cfg = st_cnt;
    p->lt_cfg_cnt = 0;
    p->st_cfg_cnt = 0;
    p->lt_cfg = lt_cfg;
    p->st_cfg = st_cfg;

    return MPP_OK;
}